

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::lowerConvertIntToFloat(I64ToI32Lowering *this,Unary *curr)

{
  UnaryOp UVar1;
  Builder *this_00;
  Builder *pBVar2;
  Builder *this_01;
  Builder *pBVar3;
  uint uVar4;
  LocalSet *any;
  Const *pCVar5;
  LocalSet *append;
  Expression *pEVar6;
  Unary *this_02;
  Unary *this_03;
  Binary *this_04;
  Binary *this_05;
  Block *pBVar7;
  Block *this_06;
  undefined1 local_d8 [8];
  TempVar highBits;
  TempVar highResult;
  TempVar lowBits;
  
  fetchOutParam((TempVar *)local_d8,this,curr->value);
  getTemp((TempVar *)&highResult.ty,this,(Type)0x2);
  getTemp((TempVar *)&highBits.ty,this,(Type)0x2);
  uVar4 = curr->op - ConvertSInt64ToFloat32;
  if (3 < uVar4) {
    abort();
  }
  if ((char)lowBits.pass != '\x01') {
    UVar1 = *(UnaryOp *)(&DAT_00de1500 + (ulong)uVar4 * 4);
    this_00 = (this->builder)._M_t.
              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
              super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    any = Builder::makeLocalSet(this_00,(Index)highResult.ty.id,curr->value);
    if ((char)highResult.pass != '\x01') {
      pBVar2 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      pCVar5 = Builder::makeConst<int>(pBVar2,0);
      append = Builder::makeLocalSet(pBVar2,(Index)highBits.ty.id,(Expression *)pCVar5);
      if ((char)lowBits.pass != '\x01') {
        pBVar2 = (this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        pEVar6 = (Expression *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x18,8);
        pEVar6->_id = LocalGetId;
        *(Index *)(pEVar6 + 1) = (Index)highResult.ty.id;
        (pEVar6->type).id = 2;
        this_02 = (Unary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x20,8);
        (this_02->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId
        ;
        (this_02->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
        this_02->op = ConvertUInt32ToFloat64;
        this_02->value = pEVar6;
        Unary::finalize(this_02);
        this_01 = (this->builder)._M_t.
                  super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                  super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        pCVar5 = Builder::makeConst<double>(this_01,4294967296.0);
        if ((char)highBits.pass != '\x01') {
          pBVar3 = (this->builder)._M_t.
                   super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                   super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
          pEVar6 = (Expression *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x18,8);
          pEVar6->_id = LocalGetId;
          *(undefined4 *)(pEVar6 + 1) = local_d8._0_4_;
          (pEVar6->type).id = 2;
          this_03 = (Unary *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x20,8);
          (this_03->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id =
               UnaryId;
          (this_03->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0
          ;
          this_03->op = UVar1;
          this_03->value = pEVar6;
          Unary::finalize(this_03);
          this_04 = (Binary *)MixedArena::allocSpace(&this_01->wasm->allocator,0x28,8);
          (this_04->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
               BinaryId;
          (this_04->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0
          ;
          this_04->op = MulFloat64;
          this_04->left = (Expression *)pCVar5;
          this_04->right = (Expression *)this_03;
          Binary::finalize(this_04);
          this_05 = (Binary *)MixedArena::allocSpace(&pBVar2->wasm->allocator,0x28,8);
          (this_05->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
               BinaryId;
          (this_05->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0
          ;
          this_05->op = AddFloat64;
          this_05->left = (Expression *)this_02;
          this_05->right = (Expression *)this_04;
          Binary::finalize(this_05);
          pBVar7 = Builder::blockify(this_00,(Expression *)any,(Expression *)append);
          pBVar7 = Builder::blockify(this_00,(Expression *)pBVar7,(Expression *)this_05);
          if ((curr->op == ConvertSInt64ToFloat32) ||
             (this_06 = pBVar7, curr->op == ConvertUInt64ToFloat32)) {
            this_06 = (Block *)MixedArena::allocSpace
                                         (&((this->builder)._M_t.
                                            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                            .super__Head_base<0UL,_wasm::Builder_*,_false>.
                                           _M_head_impl)->wasm->allocator,0x20,8);
            (this_06->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id =
                 UnaryId;
            (this_06->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
                 0;
            *(undefined4 *)&(this_06->name).super_IString.str._M_len = 0x2c;
            (this_06->name).super_IString.str._M_str = (char *)pBVar7;
            Unary::finalize((Unary *)this_06);
          }
          Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::
          replaceCurrent(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                          ).
                          super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                          .
                          super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                         ,(Expression *)this_06);
          TempVar::~TempVar((TempVar *)&highBits.ty);
          TempVar::~TempVar((TempVar *)&highResult.ty);
          TempVar::~TempVar((TempVar *)local_d8);
          return;
        }
      }
    }
  }
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

void lowerConvertIntToFloat(Unary* curr) {
    // Here the same strategy as `emcc` is taken which takes the two halves of
    // the 64-bit integer and creates a mathematical expression using float
    // arithmetic to reassemble the final floating point value.
    //
    // For example for i64 -> f32 we generate:
    //
    //  ((double) (unsigned) lowBits) +
    //      ((double) U32_MAX) * ((double) (int) highBits)
    //
    // Mostly just shuffling things around here with coercions and whatnot!
    // Note though that all arithmetic is done with f64 to have as much
    // precision as we can.
    //
    // NB: this is *not* accurate for i64 -> f32. Using f64s for intermediate
    // operations can give slightly inaccurate results in some cases, as we
    // round to an f64, then round again to an f32, which is not always the
    // same as a single rounding of i64 to f32 directly. Example:
    //
    //   #include <stdio.h>
    //   int main() {
    //     unsigned long long x = 18446743523953737727ULL;
    //     float y = x;
    //     double z = x;
    //     float w = z;
    //     printf("i64          : %llu\n"
    //            "i64->f32     : %f\n"
    //            "i64->f64     : %f\n"
    //            "i64->f64->f32: %f\n", x, y, z, w);
    //   }
    //
    //   i64          : 18446743523953737727
    //   i64->f32     : 18446742974197923840.000000 ;; correct rounding to f32
    //   i64->f64     : 18446743523953737728.000000 ;; correct rounding to f64
    //   i64->f64->f32: 18446744073709551616.000000 ;; incorrect rounding to f32
    //
    // This is even a problem if we use BigInts in JavaScript to represent
    // i64s, as Math.fround(BigInt) is not supported - the BigInt must be
    // converted to a Number first, so we again have that extra rounding.
    //
    // A more precise approach could use compiled floatdisf/floatundisf from
    // compiler-rt, but that is much larger and slower. (Note that we are in the
    // interesting situation of having f32 and f64 operations and only missing
    // i64 ones, so we have a different problem to solve than compiler-rt, and
    // maybe there is a better solution we haven't found yet.)
    TempVar highBits = fetchOutParam(curr->value);
    TempVar lowBits = getTemp();
    TempVar highResult = getTemp();

    UnaryOp convertHigh;
    switch (curr->op) {
      case ConvertSInt64ToFloat32:
      case ConvertSInt64ToFloat64:
        convertHigh = ConvertSInt32ToFloat64;
        break;
      case ConvertUInt64ToFloat32:
      case ConvertUInt64ToFloat64:
        convertHigh = ConvertUInt32ToFloat64;
        break;
      default:
        abort();
    }

    Expression* result = builder->blockify(
      builder->makeLocalSet(lowBits, curr->value),
      builder->makeLocalSet(highResult, builder->makeConst(int32_t(0))),
      builder->makeBinary(
        AddFloat64,
        builder->makeUnary(ConvertUInt32ToFloat64,
                           builder->makeLocalGet(lowBits, Type::i32)),
        builder->makeBinary(
          MulFloat64,
          builder->makeConst((double)UINT_MAX + 1),
          builder->makeUnary(convertHigh,
                             builder->makeLocalGet(highBits, Type::i32)))));

    switch (curr->op) {
      case ConvertSInt64ToFloat32:
      case ConvertUInt64ToFloat32: {
        result = builder->makeUnary(DemoteFloat64, result);
        break;
      }
      default:
        break;
    }

    replaceCurrent(result);
  }